

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.hpp
# Opt level: O0

void __thiscall OpenMD::NPA::NPA(NPA *this,SimInfo *info)

{
  undefined8 *in_RDI;
  SimInfo *in_stack_00000108;
  NPT *in_stack_00000110;
  
  NPT::NPT(in_stack_00000110,in_stack_00000108);
  *in_RDI = &PTR__NPA_00507c30;
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x1f7ed6);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x1f7eee);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x1f7f06);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x1f7f19);
  return;
}

Assistant:

NPA(SimInfo* info) : NPT(info) {}